

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

void __thiscall
embree::Texture::Texture(Texture *this,uint width,uint height,Format format,char *in)

{
  bool bVar1;
  uint uVar2;
  size_t i;
  void *__s;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  
  this->width = width;
  this->height = height;
  this->format = format;
  uVar2 = getFormatBytesPerTexel(format);
  this->bytesPerTexel = uVar2;
  this->data = (void *)0x0;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  bVar1 = isPowerOf2(width);
  uVar4 = width - 1;
  if (!bVar1) {
    uVar4 = 0;
  }
  this->width_mask = uVar4;
  bVar1 = isPowerOf2(height);
  uVar4 = height - 1;
  if (!bVar1) {
    uVar4 = 0;
  }
  this->height_mask = uVar4;
  iVar5 = height * width;
  __s = alignedUSMMalloc((ulong)(uVar2 * iVar5),0x10,DEVICE_READ_ONLY);
  this->data = __s;
  if (in != (char *)0x0) {
    for (uVar3 = 0; uVar3 < this->bytesPerTexel * iVar5; uVar3 = uVar3 + 1) {
      *(char *)((long)this->data + uVar3) = in[uVar3];
    }
    return;
  }
  memset(__s,0,(ulong)(iVar5 * this->bytesPerTexel));
  return;
}

Assistant:

Texture::Texture (unsigned width, unsigned height, const Format format, const char* in)
    : width(width), height(height), format(format), bytesPerTexel(getFormatBytesPerTexel(format)), width_mask(0), height_mask(0), data(nullptr)
  {
    width_mask  = isPowerOf2(width) ? width-1 : 0;
    height_mask = isPowerOf2(height) ? height-1 : 0;

    data = alignedUSMMalloc(bytesPerTexel*width*height,16);
    if (in) {
      for (size_t i=0; i<bytesPerTexel*width*height; i++)
	((char*)data)[i] = in[i];
    }
    else {
      memset(data,0 ,bytesPerTexel*width*height);
    }   
  }